

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall FIX::double_conversion::Bignum::AssignBignum(Bignum *this,Bignum *other)

{
  uint *puVar1;
  int iVar2;
  ulong uVar3;
  uint *puVar4;
  uint uVar5;
  long lVar6;
  
  this->exponent_ = other->exponent_;
  uVar3 = (ulong)(uint)other->used_digits_;
  if (0 < other->used_digits_) {
    puVar4 = (other->bigits_).start_;
    puVar1 = (this->bigits_).start_;
    lVar6 = 0;
    do {
      if (((other->bigits_).length_ <= lVar6) || ((this->bigits_).length_ <= lVar6))
      goto LAB_0016a5e8;
      puVar1[lVar6] = puVar4[lVar6];
      lVar6 = lVar6 + 1;
      uVar3 = (ulong)other->used_digits_;
    } while (lVar6 < (long)uVar3);
  }
  iVar2 = (int)uVar3;
  if (iVar2 < this->used_digits_) {
    puVar4 = (this->bigits_).start_ + (uVar3 & 0xffffffff);
    uVar3 = uVar3 & 0xffffffff;
    do {
      if ((iVar2 < 0) || ((this->bigits_).length_ <= (int)uVar3)) {
LAB_0016a5e8:
        __assert_fail("0 <= index && index < length_",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                      ,0xcc,
                      "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]"
                     );
      }
      *puVar4 = 0;
      uVar5 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar5;
      puVar4 = puVar4 + 1;
    } while ((int)uVar5 < this->used_digits_);
    iVar2 = other->used_digits_;
  }
  this->used_digits_ = iVar2;
  return;
}

Assistant:

void Bignum::AssignBignum(const Bignum& other) {
  exponent_ = other.exponent_;
  for (int i = 0; i < other.used_digits_; ++i) {
    bigits_[i] = other.bigits_[i];
  }
  // Clear the excess digits (if there were any).
  for (int i = other.used_digits_; i < used_digits_; ++i) {
    bigits_[i] = 0;
  }
  used_digits_ = other.used_digits_;
}